

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

void __thiscall Rml::DataViewFor::DataViewFor(DataViewFor *this,Element *element)

{
  Element *element_local;
  DataViewFor *this_local;
  
  DataView::DataView(&this->super_DataView,element,0);
  (this->super_DataView).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewFor_00815688;
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
            (&this->container_address);
  ::std::__cxx11::string::string((string *)&this->iterator_name);
  ::std::__cxx11::string::string((string *)&this->iterator_index_name);
  ::std::__cxx11::string::string((string *)&this->rml_contents);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&this->attributes);
  ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::vector(&this->elements);
  return;
}

Assistant:

DataViewFor::DataViewFor(Element* element) : DataView(element, 0) {}